

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Point3f __thiscall pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Point3f p,Float time)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float x;
  float fVar17;
  Point3f PVar18;
  Point3f PVar19;
  Point3f PVar20;
  Transform t;
  Transform local_88;
  undefined1 auVar9 [16];
  
  auVar14._4_60_ = p._12_60_;
  auVar14._0_4_ = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._8_56_ = p._8_56_;
  auVar8._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9 = auVar14._0_16_;
  auVar6 = auVar8._0_16_;
  fVar17 = p.super_Tuple3<pbrt::Point3,_float>.x;
  if ((this->actuallyAnimated != true) || (time <= this->startTime)) {
    auVar15 = vmovshdup_avx(auVar6);
    auVar4 = vinsertps_avx(*(undefined1 (*) [16])((this->startTransform).m.m[0] + 1),
                           ZEXT416((uint)(this->startTransform).m.m[1][1]),0x10);
    fVar5 = auVar15._0_4_;
    auVar10._0_4_ = fVar5 * auVar4._0_4_;
    auVar10._4_4_ = auVar15._4_4_ * auVar4._4_4_;
    auVar10._8_4_ = auVar15._8_4_ * auVar4._8_4_;
    auVar10._12_4_ = auVar15._12_4_ * auVar4._12_4_;
    auVar4 = vinsertps_avx((undefined1  [16])(this->startTransform).m.m[0],
                           ZEXT416((uint)(this->startTransform).m.m[1][0]),0x10);
    auVar15._4_4_ = fVar17;
    auVar15._0_4_ = fVar17;
    auVar15._8_4_ = fVar17;
    auVar15._12_4_ = fVar17;
    auVar15 = vfmadd213ps_fma(auVar15,auVar4,auVar10);
    auVar4 = vinsertps_avx(*(undefined1 (*) [16])((this->startTransform).m.m[0] + 2),
                           ZEXT416((uint)(this->startTransform).m.m[1][2]),0x10);
    auVar11._4_4_ = auVar14._0_4_;
    auVar11._0_4_ = auVar14._0_4_;
    auVar11._8_4_ = auVar14._0_4_;
    auVar11._12_4_ = auVar14._0_4_;
    auVar15 = vfmadd213ps_fma(auVar11,auVar4,auVar15);
    auVar4 = vinsertps_avx(*(undefined1 (*) [16])((this->startTransform).m.m[0] + 3),
                           ZEXT416((uint)(this->startTransform).m.m[1][3]),0x10);
    auVar7._0_4_ = auVar4._0_4_ + auVar15._0_4_;
    auVar7._4_4_ = auVar4._4_4_ + auVar15._4_4_;
    auVar7._8_4_ = auVar4._8_4_ + auVar15._8_4_;
    auVar7._12_4_ = auVar4._12_4_ + auVar15._12_4_;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->startTransform).m.m[2][1])),auVar6,
                             ZEXT416((uint)(this->startTransform).m.m[2][0]));
    auVar4 = vfmadd231ss_fma(auVar4,auVar9,ZEXT416((uint)(this->startTransform).m.m[2][2]));
    fVar2 = auVar4._0_4_ + (this->startTransform).m.m[2][3];
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->startTransform).m.m[3][1])),auVar6,
                             ZEXT416((uint)(this->startTransform).m.m[3][0]));
    auVar6 = vfmadd231ss_fma(auVar6,auVar9,ZEXT416((uint)(this->startTransform).m.m[3][2]));
    fVar17 = auVar6._0_4_ + (this->startTransform).m.m[3][3];
  }
  else {
    if (time < this->endTime) {
      Interpolate(&local_88,this,time);
      auVar4 = vmovshdup_avx(auVar6);
      fVar5 = auVar4._0_4_;
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_88.m.m[0][1])),auVar6,
                               ZEXT416((uint)local_88.m.m[0][0]));
      auVar4 = vfmadd231ss_fma(auVar4,auVar9,ZEXT416((uint)local_88.m.m[0][2]));
      fVar17 = auVar4._0_4_ + local_88.m.m[0][3];
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_88.m.m[1][1])),auVar6,
                               ZEXT416((uint)local_88.m.m[1][0]));
      auVar4 = vfmadd231ss_fma(auVar4,auVar9,ZEXT416((uint)local_88.m.m[1][2]));
      fVar2 = auVar4._0_4_ + local_88.m.m[1][3];
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_88.m.m[2][1])),auVar6,
                               ZEXT416((uint)local_88.m.m[2][0]));
      auVar4 = vfmadd231ss_fma(auVar4,auVar9,ZEXT416((uint)local_88.m.m[2][2]));
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_88.m.m[3][1])),auVar6,
                               ZEXT416((uint)local_88.m.m[3][0]));
      auVar6 = vfmadd231ss_fma(auVar6,auVar9,ZEXT416((uint)local_88.m.m[3][2]));
      fVar5 = auVar6._0_4_ + local_88.m.m[3][3];
      bVar1 = fVar5 == 1.0;
      fVar3 = auVar4._0_4_ + local_88.m.m[2][3];
      auVar6 = vinsertps_avx(ZEXT416((uint)bVar1 * (int)fVar17 +
                                     (uint)!bVar1 * (int)(fVar17 / fVar5)),
                             ZEXT416((uint)bVar1 * (int)fVar2 + (uint)!bVar1 * (int)(fVar2 / fVar5))
                             ,0x10);
      PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar6._0_8_;
      PVar18.super_Tuple3<pbrt::Point3,_float>.z =
           (float)((uint)bVar1 * (int)fVar3 + (uint)!bVar1 * (int)(fVar3 / fVar5));
      return (Point3f)PVar18.super_Tuple3<pbrt::Point3,_float>;
    }
    auVar15 = vmovshdup_avx(auVar6);
    auVar4 = vinsertps_avx(*(undefined1 (*) [16])((this->endTransform).m.m[0] + 1),
                           ZEXT416((uint)(this->endTransform).m.m[1][1]),0x10);
    fVar5 = auVar15._0_4_;
    auVar12._0_4_ = fVar5 * auVar4._0_4_;
    auVar12._4_4_ = auVar15._4_4_ * auVar4._4_4_;
    auVar12._8_4_ = auVar15._8_4_ * auVar4._8_4_;
    auVar12._12_4_ = auVar15._12_4_ * auVar4._12_4_;
    auVar4 = vinsertps_avx((undefined1  [16])(this->endTransform).m.m[0],
                           ZEXT416((uint)(this->endTransform).m.m[1][0]),0x10);
    auVar16._4_4_ = fVar17;
    auVar16._0_4_ = fVar17;
    auVar16._8_4_ = fVar17;
    auVar16._12_4_ = fVar17;
    auVar15 = vfmadd213ps_fma(auVar16,auVar4,auVar12);
    auVar4 = vinsertps_avx(*(undefined1 (*) [16])((this->endTransform).m.m[0] + 2),
                           ZEXT416((uint)(this->endTransform).m.m[1][2]),0x10);
    auVar13._4_4_ = auVar14._0_4_;
    auVar13._0_4_ = auVar14._0_4_;
    auVar13._8_4_ = auVar14._0_4_;
    auVar13._12_4_ = auVar14._0_4_;
    auVar15 = vfmadd213ps_fma(auVar13,auVar4,auVar15);
    auVar4 = vinsertps_avx(*(undefined1 (*) [16])((this->endTransform).m.m[0] + 3),
                           ZEXT416((uint)(this->endTransform).m.m[1][3]),0x10);
    auVar7._0_4_ = auVar4._0_4_ + auVar15._0_4_;
    auVar7._4_4_ = auVar4._4_4_ + auVar15._4_4_;
    auVar7._8_4_ = auVar4._8_4_ + auVar15._8_4_;
    auVar7._12_4_ = auVar4._12_4_ + auVar15._12_4_;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->endTransform).m.m[2][1])),auVar6,
                             ZEXT416((uint)(this->endTransform).m.m[2][0]));
    auVar4 = vfmadd231ss_fma(auVar4,auVar9,ZEXT416((uint)(this->endTransform).m.m[2][2]));
    fVar2 = auVar4._0_4_ + (this->endTransform).m.m[2][3];
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (this->endTransform).m.m[3][1])),auVar6,
                             ZEXT416((uint)(this->endTransform).m.m[3][0]));
    auVar6 = vfmadd231ss_fma(auVar6,auVar9,ZEXT416((uint)(this->endTransform).m.m[3][2]));
    fVar17 = auVar6._0_4_ + (this->endTransform).m.m[3][3];
  }
  if ((fVar17 == 1.0) && (!NAN(fVar17))) {
    PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar7._0_8_;
    PVar19.super_Tuple3<pbrt::Point3,_float>.z = fVar2;
    return (Point3f)PVar19.super_Tuple3<pbrt::Point3,_float>;
  }
  auVar6._4_4_ = fVar17;
  auVar6._0_4_ = fVar17;
  auVar6._8_4_ = fVar17;
  auVar6._12_4_ = fVar17;
  auVar6 = vdivps_avx(auVar7,auVar6);
  PVar20.super_Tuple3<pbrt::Point3,_float>.z = fVar2 / fVar17;
  PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar6._0_8_;
  return (Point3f)PVar20.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f AnimatedTransform::operator()(Point3f p, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(p);
    else if (time >= endTime)
        return endTransform(p);
    Transform t = Interpolate(time);
    return t(p);
}